

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::unsetCursor(QWidget *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  lVar3 = *(long *)(lVar2 + 0x78);
  if (lVar3 != 0) {
    std::__uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_>::reset
              ((__uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_> *)(lVar3 + 0x18),
               (pointer)0x0);
  }
  if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    uVar1 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
    if ((uVar1 & 0x40) != 0) {
      *(uint *)(*(long *)&this->field_0x8 + 0x240) = uVar1 & 0xffffffbf;
    }
  }
  qt_qpa_set_cursor(*(QWidget **)(lVar2 + 8),false);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_28,CursorChange);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_28);
  QEvent::~QEvent((QEvent *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::unsetCursor()
{
    Q_D(QWidget);
    if (d->extra)
        d->extra->curs.reset();
    if (!isWindow())
        setAttribute(Qt::WA_SetCursor, false);
    d->unsetCursor_sys();

    QEvent event(QEvent::CursorChange);
    QCoreApplication::sendEvent(this, &event);
}